

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O1

ssize_t __thiscall LASindex::read(LASindex *this,int __fd,void *__buf,size_t __nbytes)

{
  BOOL BVar1;
  int in_EAX;
  LASquadtree *pLVar2;
  ssize_t sVar3;
  LASinterval *pLVar4;
  void *__buf_00;
  void *__buf_01;
  undefined8 unaff_RBP;
  ulong uVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  char *fmt;
  char signature [4];
  U32 version;
  int local_28;
  undefined1 local_24 [4];
  
  plVar6 = (long *)CONCAT44(in_register_00000034,__fd);
  pLVar2 = this->spatial;
  local_28 = in_EAX;
  if (pLVar2 != (LASquadtree *)0x0) {
    LASquadtree::~LASquadtree(pLVar2);
    operator_delete(pLVar2);
    this->spatial = (LASquadtree *)0x0;
  }
  pLVar4 = this->interval;
  if (pLVar4 != (LASinterval *)0x0) {
    LASinterval::~LASinterval(pLVar4);
    operator_delete(pLVar4);
    this->interval = (LASinterval *)0x0;
  }
  (**(code **)(*plVar6 + 8))(plVar6,&local_28,4);
  if (local_28 == 0x5853414c) {
    (**(code **)(*plVar6 + 0x18))(plVar6,local_24);
    pLVar2 = (LASquadtree *)operator_new(0xa8);
    LASquadtree::LASquadtree(pLVar2);
    this->spatial = pLVar2;
    sVar3 = LASquadtree::read(pLVar2,__fd,__buf_00,__nbytes);
    if ((char)sVar3 == '\0') {
      fmt = "(LASindex): cannot read LASspatial (LASquadtree)";
    }
    else {
      pLVar4 = (LASinterval *)operator_new(0x58);
      LASinterval::LASinterval(pLVar4,1000);
      this->interval = pLVar4;
      sVar3 = LASinterval::read(pLVar4,__fd,__buf_01,__nbytes);
      if ((char)sVar3 != '\0') {
        LASinterval::get_cells(this->interval);
        BVar1 = LASinterval::has_cells(this->interval);
        uVar5 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
        while (BVar1 != false) {
          LASquadtree::manage_cell(this->spatial,this->interval->index,false);
          BVar1 = LASinterval::has_cells(this->interval);
        }
        goto LAB_00120aef;
      }
      fmt = "(LASindex): reading LASinterval";
    }
    LASMessage(LAS_ERROR,fmt);
  }
  else {
    LASMessage(LAS_ERROR,"(LASindex): wrong signature %4s instead of \'LASX\'",&local_28);
  }
  uVar5 = 0;
  if (halt_on_error == true) {
    byebye();
    uVar5 = 0;
  }
LAB_00120aef:
  return uVar5 & 0xffffffff;
}

Assistant:

BOOL LASindex::read(ByteStreamIn* stream)
{
  if (spatial)
  {
    delete spatial;
    spatial = 0;
  }
  if (interval)
  {
    delete interval;
    interval = 0;
  }
  char signature[4];
  try { stream->getBytes((U8*)signature, 4); } catch (...)
  {
    laserror("(LASindex): reading signature");
    return FALSE;
  }
  if (strncmp(signature, "LASX", 4) != 0)
  {
    laserror("(LASindex): wrong signature %4s instead of 'LASX'", signature);
    return FALSE;
  }
  U32 version;
  try { stream->get32bitsLE((U8*)&version); } catch (...)
  {
    laserror("(LASindex): reading version");
    return FALSE;
  }
  // read spatial quadtree
  spatial = new LASquadtree();
  if (!spatial->read(stream))
  {
    laserror("(LASindex): cannot read LASspatial (LASquadtree)");
    return FALSE;
  }
  // read interval
  interval = new LASinterval();
  if (!interval->read(stream))
  {
    laserror("(LASindex): reading LASinterval");
    return FALSE;
  }
  // tell spatial about the existing cells
  interval->get_cells();
  while (interval->has_cells())
  {
    spatial->manage_cell(interval->index);
  }
  return TRUE;
}